

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void google::LogDestination::SetStderrLogging(LogSeverity min_severity)

{
  if ((uint)min_severity < 4) {
    ::glog_internal_namespace_::Mutex::Lock((Mutex *)log_mutex);
    fLI::FLAGS_stderrthreshold = min_severity;
    ::glog_internal_namespace_::Mutex::Unlock((Mutex *)log_mutex);
    return;
  }
  __assert_fail("min_severity >= 0 && min_severity < NUM_SEVERITIES",
                "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/logging.cc"
                ,0x2c6,"static void google::LogDestination::SetStderrLogging(LogSeverity)");
}

Assistant:

inline void LogDestination::SetStderrLogging(LogSeverity min_severity) {
  assert(min_severity >= 0 && min_severity < NUM_SEVERITIES);
  // Prevent any subtle race conditions by wrapping a mutex lock around
  // all this stuff.
  MutexLock l(&log_mutex);
  FLAGS_stderrthreshold = min_severity;
}